

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EveryHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Var pvVar6;
  RecyclableObject *callBackFn;
  undefined4 *puVar7;
  undefined8 uVar8;
  JavascriptMethod p_Var9;
  uint64 uVar10;
  uint64 uVar11;
  undefined4 extraout_var;
  JavascriptBoolean *pJVar12;
  char16_t *varName;
  Type *pTVar13;
  JavascriptBoolean *pJVar14;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_50;
  
  local_88 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_88)->noJsReentrancy;
  ((ThreadContext *)local_88)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pArr);
  if (((ulong)args->Info & 0xfffffe) != 0) {
    pvVar6 = Arguments::operator[](args,1);
    bVar3 = JavascriptConversion::IsCallable(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[](args,1);
      callBackFn = VarTo<Js::RecyclableObject>(pvVar6);
      if ((*(uint *)&args->Info & 0xffffff) < 3) {
        local_50 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        local_50 = (RecyclableObject *)Arguments::operator[](args,2);
      }
      if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
        bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
        if (bVar3) {
          typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
        }
        else {
          typedArrayBase = (TypedArrayBase *)0x0;
        }
      }
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pJVar12 = (JavascriptBoolean *)
                  EveryObjectHelper<unsigned_long>(obj,length,0,callBackFn,local_50,scriptContext);
      }
      else {
        bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
        if (!bVar3) {
          bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x22f7,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar3) {
LAB_00ba83b0:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar7 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        pJVar12 = (JavascriptBoolean *)
                  (ulong)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
        if (pJVar12 < length) {
          length = (unsigned_long)pJVar12;
        }
        bVar3 = (JavascriptBoolean *)length != (JavascriptBoolean *)0x0;
        if (bVar3) {
          jsReentLock._24_8_ = typedArrayBase;
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          pJVar14 = (JavascriptBoolean *)0x0;
          do {
            uVar8 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))
                              (jsReentLock._24_8_,(ulong)pJVar14 & 0xffffffff);
            *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            this = scriptContext->threadContext;
            bVar1 = this->reentrancySafeOrHandled;
            this->reentrancySafeOrHandled = true;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
            if (scriptContext->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var9 = RecyclableObject::GetEntryPoint(callBackFn);
            CheckIsExecutable(callBackFn,p_Var9);
            p_Var9 = RecyclableObject::GetEntryPoint(callBackFn);
            if ((int)pJVar14 < 0) {
              value = (double)((ulong)pJVar14 & 0xffffffff);
              uVar10 = NumberUtilities::ToSpecial(value);
              bVar4 = NumberUtilities::IsNan(value);
              if (((bVar4) &&
                  (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000)) &&
                 (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar7 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar4) goto LAB_00ba83b0;
                *puVar7 = 0;
              }
              pTVar13 = (Type *)(uVar10 ^ 0xfffc000000000000);
            }
            else {
              pTVar13 = &pJVar14[0xaaaaaaaaaaa].value;
            }
            pvVar6 = (*p_Var9)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_50,
                               uVar8,pTVar13,jsReentLock._24_8_);
            this->reentrancySafeOrHandled = bVar1;
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            *(bool *)((long)local_88 + 0x108) = true;
            BVar5 = JavascriptConversion::ToBoolean(pvVar6,scriptContext);
            pJVar12 = (JavascriptBoolean *)CONCAT44(extraout_var,BVar5);
            if (BVar5 == 0) {
              pJVar12 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).booleanFalse.ptr;
              break;
            }
            pJVar14 = (JavascriptBoolean *)
                      ((long)&(pJVar14->super_RecyclableObject).super_FinalizableObject.
                              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
            bVar3 = pJVar14 < length;
          } while (pJVar14 != (JavascriptBoolean *)length);
        }
        if (!bVar3) {
          pJVar12 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                    super_JavascriptLibraryBase).booleanTrue.ptr;
        }
      }
      *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      return pJVar12;
    }
  }
  varName = L"[TypedArray].prototype.every";
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    varName = L"Array.prototype.every";
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
}

Assistant:

Var JavascriptArray::EveryHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.every"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.every"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;


        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;
        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (!JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetFalse();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::EveryObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetTrue();
    }